

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O0

bool __thiscall KDReports::ReportPrivate::skipHeadersFooters(ReportPrivate *this)

{
  qreal qVar1;
  QMessageLogger local_40;
  QDebug local_20;
  byte local_11;
  ReportPrivate *pRStack_10;
  bool skip;
  ReportPrivate *this_local;
  
  pRStack_10 = this;
  qVar1 = rawMainTextDocHeight(this);
  local_11 = qVar1 <= 0.0;
  if ((bool)local_11) {
    QMessageLogger::QMessageLogger
              (&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsReport.cpp"
               ,0x94,"bool KDReports::ReportPrivate::skipHeadersFooters() const");
    QMessageLogger::debug();
    QDebug::operator<<(&local_20,
                       "Not enough height for headers and footers in this page size, hiding headers and footers."
                      );
    QDebug::~QDebug(&local_20);
  }
  return (bool)(local_11 & 1);
}

Assistant:

bool KDReports::ReportPrivate::skipHeadersFooters() const
{
    const bool skip = rawMainTextDocHeight() <= 0;
    if (skip) {
        qDebug() << "Not enough height for headers and footers in this page size, hiding headers and footers.";
    }
    return skip;
}